

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O1

void __thiscall wasm::StackIROptimizer::local2Stack(StackIROptimizer *this)

{
  Op OVar1;
  uint setIndex;
  StackInst *inst;
  LocalSet *set;
  _Base_ptr p_Var2;
  pointer pvVar3;
  bool bVar4;
  Index IVar5;
  float fVar6;
  pointer ppSVar7;
  size_type sVar8;
  ulong uVar9;
  Sets *pSVar10;
  SetInfluences *pSVar11;
  _Base_ptr p_Var12;
  LazyLocalGraph *this_00;
  LazyLocalGraph *pLVar13;
  LazyLocalGraph *this_01;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  undefined1 local_238 [8];
  LazyLocalGraph localGraph;
  unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
  deferredGets;
  undefined1 auStack_88 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  savedValues;
  LocalGet *get;
  float local_60;
  uint local_5c;
  Index null;
  iterator iStack_50;
  uint *local_48;
  float local_34;
  
  LazyLocalGraph::LazyLocalGraph
            ((LazyLocalGraph *)local_238,this->func,(Module *)0x0,
             (optional<wasm::Expression::Id>)0x0);
  this_00 = (LazyLocalGraph *)&localGraph.flower;
  findStringViewDeferredGets
            ((unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
              *)this_00,this);
  local_60 = -NAN;
  local_48 = (uint *)0x0;
  _null = (Module *)0x0;
  iStack_50._M_current = (uint *)0x0;
  savedValues.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_88 = (undefined1  [8])0x0;
  savedValues.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_34 = 0.0;
  ppSVar7 = (this->insts->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->insts->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
      _M_impl.super__Vector_impl_data._M_finish != ppSVar7) {
    uVar9 = 0;
    do {
      this_01 = (LazyLocalGraph *)&null;
      pLVar13 = (LazyLocalGraph *)&localGraph.flower;
      inst = ppSVar7[uVar9];
      if (inst != (StackInst *)0x0) {
        for (IVar5 = getNumConsumedValues((StackIROptimizer *)this_00,inst); IVar5 != 0;
            IVar5 = IVar5 - 1) {
          if ((Module *)iStack_50._M_current == _null) {
            __assert_fail("values.size() > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack-opts.cpp"
                          ,0xb2,"void wasm::StackIROptimizer::local2Stack()");
          }
          while (iStack_50._M_current =
                      (uint *)((long)&(((Module *)((long)iStack_50._M_current + -0x3f0))->tagsMap).
                                      _M_h._M_single_bucket + 4),
                (uint)(((Importable *)&((Module *)iStack_50._M_current)->exports)->super_Named).name
                      .super_IString.str._M_len != 0xffffffff) {
            if ((Module *)iStack_50._M_current == _null) {
              __assert_fail("values.size() > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack-opts.cpp"
                            ,0xb7,"void wasm::StackIROptimizer::local2Stack()");
            }
          }
        }
        OVar1 = inst->op;
        if (OVar1 < (TryTableEnd|BlockBegin)) {
          if ((0x58a4U >> (OVar1 & 0x1f) & 1) == 0) {
            if ((0x214aU >> (OVar1 & 0x1f) & 1) == 0) {
              pvVar3 = savedValues.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (OVar1 == Basic) goto LAB_00cbe8c7;
            }
            else {
              this_00 = (LazyLocalGraph *)auStack_88;
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)this_00,(value_type *)this_01);
            }
            goto LAB_00cbe876;
          }
          if (auStack_88 ==
              (undefined1  [8])
              savedValues.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            __assert_fail("!savedValues.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack-opts.cpp"
                          ,0xc4,"void wasm::StackIROptimizer::local2Stack()");
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01,
                     savedValues.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + -1);
          this_00 = (LazyLocalGraph *)
                    savedValues.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[-1].
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pvVar3 = savedValues.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + -1;
          if (this_00 != (LazyLocalGraph *)0x0) {
            pvVar3 = savedValues.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + -1;
            savedValues.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 savedValues.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + -1;
            operator_delete(this_00,(long)(pvVar3->
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)this_00);
            pvVar3 = savedValues.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
        }
        else {
LAB_00cbe876:
          pvVar3 = savedValues.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((Module *)iStack_50._M_current != _null) {
            iStack_50._M_current = (uint *)_null;
          }
        }
LAB_00cbe8c7:
        savedValues.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = pvVar3;
        uVar9 = (inst->type).id;
        if (uVar9 < 2) {
          if ((uVar9 == 0) && (inst->origin->_id == LocalSetId)) {
            fVar6 = local_34;
            if (iStack_50._M_current != local_48) goto LAB_00cbe934;
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_01,iStack_50,
                       (uint *)&local_34);
            this_00 = this_01;
          }
        }
        else {
          savedValues.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)inst->origin;
          if (((Expression *)
              savedValues.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)->_id != LocalGetId) {
            savedValues.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          }
          if (((((Expression *)
                 savedValues.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage != (Expression *)0x0) &&
               ((6 < uVar9 & (byte)uVar9) == 0)) &&
              (sVar8 = std::
                       _Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::count((_Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                *)pLVar13,
                               (key_type *)
                               &savedValues.
                                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage),
              fVar6 = local_34, this_00 = pLVar13, sVar8 == 0)) &&
             ((long)iStack_50._M_current - (long)_null != 0)) {
            uVar9 = (ulong)(uint)local_34;
            uVar14 = (int)((ulong)((long)iStack_50._M_current - (long)_null) >> 2) - 1;
            local_5c = 0;
            do {
              setIndex = *(uint *)((long)&(((Importable *)&_null->exports)->super_Named).name.
                                          super_IString.str._M_len + (ulong)uVar14 * 4);
              uVar15 = (ulong)setIndex;
              if (uVar15 == 0xffffffff) {
                bVar16 = false;
              }
              else {
                set = (LocalSet *)
                      (this->insts->
                      super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
                      _M_impl.super__Vector_impl_data._M_start[uVar15]->origin;
                if ((set->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id !=
                    LocalSetId) {
                  __assert_fail("int(_id) == int(T::SpecificId)",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                                ,0x31b,"T *wasm::Expression::cast() [T = wasm::LocalSet]");
                }
                if (set->index ==
                    *(Index *)&((savedValues.
                                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  pLVar13 = (LazyLocalGraph *)local_238;
                  pSVar10 = LazyLocalGraph::getSets
                                      (pLVar13,(LocalGet *)
                                               savedValues.
                                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  p_Var2 = (_Base_ptr)
                           (pSVar10->
                           super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                           ).flexible._M_t._M_impl.super__Rb_tree_header._M_node_count;
                  p_Var12 = p_Var2;
                  if (p_Var2 == (_Base_ptr)0x0) {
                    p_Var12 = (_Base_ptr)
                              (pSVar10->
                              super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                              ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
                  }
                  bVar16 = true;
                  if (p_Var12 == (_Base_ptr)0x1) {
                    p_Var12 = p_Var2;
                    if (p_Var2 != (_Base_ptr)0x0) {
                      p_Var12 = (pSVar10->
                                super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                                ).flexible._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                    }
                    p_Var12 = p_Var12 + 1;
                    if (p_Var2 == (_Base_ptr)0x0) {
                      p_Var12 = (_Base_ptr)
                                &(pSVar10->
                                 super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                                 ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage;
                    }
                    if (*(LocalSet **)p_Var12 == set) {
                      pLVar13 = (LazyLocalGraph *)local_238;
                      pSVar11 = LazyLocalGraph::getSetInfluences(pLVar13,set);
                      if (((pSVar11->_M_h)._M_element_count == 1) &&
                         (pLVar13 = (LazyLocalGraph *)this,
                         bVar4 = canRemoveSetGetPair(this,setIndex,(Index)fVar6), bVar4)) {
                        if ((pointer)(pSVar11->_M_h)._M_before_begin._M_nxt[1]._M_nxt !=
                            savedValues.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                          __assert_fail("*setInfluences.begin() == get",
                                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack-opts.cpp"
                                        ,0xeb,"void wasm::StackIROptimizer::local2Stack()");
                        }
                        bVar16 = false;
                        (this->insts->
                        super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
                        _M_impl.super__Vector_impl_data._M_start[uVar15] = (StackInst *)0x0;
                        (this->insts->
                        super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
                        _M_impl.super__Vector_impl_data._M_start[uVar9] = (StackInst *)0x0;
                        *(uint *)((long)&(((Importable *)&_null->exports)->super_Named).name.
                                         super_IString.str._M_len + (ulong)uVar14 * 4) = 0xffffffff;
                        local_5c = (uint)CONCAT71((int7)((ulong)_null >> 8),1);
                      }
                    }
                  }
                  if (!bVar16) {
                    bVar16 = false;
                    goto LAB_00cbead4;
                  }
                }
                bVar16 = uVar14 != 0;
                bVar4 = uVar14 == 0;
                uVar14 = uVar14 - 1;
                if (bVar4) {
                  uVar14 = 0;
                }
              }
LAB_00cbead4:
            } while (bVar16);
            this_00 = pLVar13;
            if ((local_5c & 1) != 0) goto LAB_00cbe95a;
          }
          pLVar13 = (LazyLocalGraph *)&null;
          fVar6 = local_60;
          if (iStack_50._M_current == local_48) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)pLVar13,iStack_50,
                       (uint *)&local_60);
            this_00 = pLVar13;
          }
          else {
LAB_00cbe934:
            *iStack_50._M_current = (uint)fVar6;
            iStack_50._M_current = iStack_50._M_current + 1;
          }
        }
      }
LAB_00cbe95a:
      local_34 = (float)((int)local_34 + 1);
      uVar9 = (ulong)(uint)local_34;
      ppSVar7 = (this->insts->
                super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(this->insts->
                                   super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar7 >> 3)
            );
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)auStack_88);
  if (_null != (Module *)0x0) {
    operator_delete(_null,(long)local_48 - (long)_null);
  }
  std::
  _Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&localGraph.flower);
  LazyLocalGraph::~LazyLocalGraph((LazyLocalGraph *)local_238);
  return;
}

Assistant:

void StackIROptimizer::local2Stack() {
  // We use the localGraph to tell us if a get-set pair is indeed a set that is
  // read by that get, and only that get. Note that we run this on Binaryen IR,
  // so we are assuming that no previous opt has changed the interaction of
  // local operations.
  //
  // We use a lazy graph here as we only query in the rare case when we find a
  // set/get pair that looks optimizable.
  LazyLocalGraph localGraph(func);
  // The binary writing of StringWTF16Get and StringSliceWTF is optimized to use
  // fewer scratch locals when their operands are already LocalGets. To avoid
  // interfering with that optimization, we have to avoid removing such
  // LocalGets.
  auto deferredGets = findStringViewDeferredGets();

  // We maintain a stack of relevant values. This contains:
  //  * a null for each actual value that the value stack would have
  //  * an index of each LocalSet that *could* be on the value
  //    stack at that location.
  const Index null = -1;
  std::vector<Index> values;
  // We also maintain a stack of values vectors for control flow,
  // saving the stack as we enter and restoring it when we exit.
  std::vector<std::vector<Index>> savedValues;
#ifdef STACK_OPT_DEBUG
  std::cout << "func: " << func->name << '\n' << insts << '\n';
#endif
  for (Index instIndex = 0; instIndex < insts.size(); instIndex++) {
    auto* inst = insts[instIndex];
    if (!inst) {
      continue;
    }
    // First, consume values from the stack as required.
    auto consumed = getNumConsumedValues(inst);
#ifdef STACK_OPT_DEBUG
    std::cout << "  " << instIndex << " : " << *inst << ", " << values.size()
              << " on stack, will consume " << consumed << "\n    ";
    for (auto s : values)
      std::cout << s << ' ';
    std::cout << '\n';
#endif
    // TODO: currently we run dce before this, but if we didn't, we'd need
    //       to handle unreachable code here - it's ok to pop multiple values
    //       there even if the stack is at size 0.
    while (consumed > 0) {
      assert(values.size() > 0);
      // Whenever we hit a possible stack value, kill it - it would
      // be consumed here, so we can never optimize to it.
      while (values.back() != null) {
        values.pop_back();
        assert(values.size() > 0);
      }
      // Finally, consume the actual value that is consumed here.
      values.pop_back();
      consumed--;
    }
    // After consuming, we can see what to do with this. First, handle
    // control flow.
    if (isControlFlowBegin(inst)) {
      // Save the stack for when we end this control flow.
      savedValues.push_back(values); // TODO: optimize copies
      values.clear();
    } else if (isControlFlowEnd(inst)) {
      assert(!savedValues.empty());
      values = savedValues.back();
      savedValues.pop_back();
    } else if (isControlFlow(inst)) {
      // Otherwise, in the middle of control flow, just clear it
      values.clear();
    }
    // This is something we should handle, look into it.
    if (inst->type.isConcrete()) {
      bool optimized = false;
      // Do not optimize multivalue locals, since those will be better
      // optimized when they are visited in the binary writer and this
      // optimization would intefere with that one.
      if (auto* get = inst->origin->dynCast<LocalGet>();
          get && inst->type.isSingle() && !deferredGets.count(get)) {
        // Use another local to clarify what instIndex means in this scope.
        auto getIndex = instIndex;

        // This is a potential optimization opportunity! See if we
        // can reach the set.
        if (values.size() > 0) {
          Index j = values.size() - 1;
          while (1) {
            // If there's an actual value in the way, we've failed.
            auto setIndex = values[j];
            if (setIndex == null) {
              break;
            }
            auto* set = insts[setIndex]->origin->cast<LocalSet>();
            if (set->index == get->index) {
              // This might be a proper set-get pair, where the set is
              // used by this get and nothing else, check that.
              auto& sets = localGraph.getSets(get);
              if (sets.size() == 1 && *sets.begin() == set) {
                auto& setInfluences = localGraph.getSetInfluences(set);
                // If this has the proper value of 1, also do the potentially-
                // expensive check of whether we can remove this pair at all.
                if (setInfluences.size() == 1 &&
                    canRemoveSetGetPair(setIndex, getIndex)) {
                  assert(*setInfluences.begin() == get);
                  // Do it! The set and the get can go away, the proper
                  // value is on the stack.
#ifdef STACK_OPT_DEBUG
                  std::cout << "  stackify the get\n";
#endif
                  insts[setIndex] = nullptr;
                  insts[getIndex] = nullptr;
                  // Continuing on from here, replace this on the stack
                  // with a null, representing a regular value. We
                  // keep possible values above us active - they may
                  // be optimized later, as they would be pushed after
                  // us, and used before us, so there is no conflict.
                  values[j] = null;
                  optimized = true;
                  break;
                }
              }
            }
            // We failed here. Can we look some more?
            if (j == 0) {
              break;
            }
            j--;
          }
        }
      }
      if (!optimized) {
        // This is an actual regular value on the value stack.
        values.push_back(null);
      }
    } else if (inst->origin->is<LocalSet>() && inst->type == Type::none) {
      // This set is potentially optimizable later, add to stack.
      values.push_back(instIndex);
    }
  }
}